

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

Optional<Corrade::Containers::Array<char,_Corrade::Utility::Path::MapDeleter>_> * __thiscall
Corrade::Utility::Path::mapWrite
          (Optional<Corrade::Containers::Array<char,_Corrade::Utility::Path::MapDeleter>_>
           *__return_storage_ptr__,Path *this,StringView filename,size_t size)

{
  int __fd;
  __off_t _Var1;
  ssize_t sVar2;
  char *pcVar3;
  Debug *pDVar4;
  int *piVar5;
  size_t __len;
  StringView value;
  StringView value_00;
  StringView value_01;
  StringView value_02;
  Error err;
  undefined1 local_58 [48];
  
  __len = filename._sizePlusFlags;
  value._sizePlusFlags = filename._data;
  __fd = open((char *)this,0x242,0x180);
  if (__fd == -1) {
    Error::Error((Error *)local_58,(Flags)0x0);
    pDVar4 = Debug::operator<<((Debug *)local_58,"Utility::Path::mapWrite(): can\'t open");
    value_00._sizePlusFlags = (size_t)value._sizePlusFlags;
    value_00._data = (char *)this;
    pDVar4 = Debug::operator<<(pDVar4,value_00);
    (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
    Debug::operator<<(pDVar4,":");
    piVar5 = __errno_location();
    Implementation::printErrnoErrorString((Debug *)local_58,*piVar5);
  }
  else {
    if (__len == 0) {
      pcVar3 = (char *)0x0;
LAB_00159a9f:
      __return_storage_ptr__->_set = true;
      (__return_storage_ptr__->field_0)._value._data = pcVar3;
      (__return_storage_ptr__->field_0)._value._size = __len;
      *(int *)((long)&__return_storage_ptr__->field_0 + 0x10) = __fd;
      local_58._0_8_ = (ostream *)0x0;
      local_58._8_8_ = 0;
      local_58._16_4_ = 0;
      Containers::Array<char,_Corrade::Utility::Path::MapDeleter>::~Array
                ((Array<char,_Corrade::Utility::Path::MapDeleter> *)local_58);
      return __return_storage_ptr__;
    }
    _Var1 = lseek(__fd,__len - 1,0);
    if (_Var1 == -1) {
      Error::Error((Error *)local_58,(Flags)0x0);
      pDVar4 = Debug::operator<<((Debug *)local_58,
                                 "Utility::Path::mapWrite(): can\'t seek to resize");
      value_01._sizePlusFlags = (size_t)value._sizePlusFlags;
      value_01._data = (char *)this;
      pDVar4 = Debug::operator<<(pDVar4,value_01);
      (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
      Debug::operator<<(pDVar4,":");
      piVar5 = __errno_location();
      Implementation::printErrnoErrorString((Debug *)local_58,*piVar5);
      close(__fd);
    }
    else {
      sVar2 = ::write(__fd,"",1);
      if (sVar2 == 1) {
        pcVar3 = (char *)mmap((void *)0x0,__len,3,1,__fd,0);
        if (pcVar3 != (char *)0xffffffffffffffff) goto LAB_00159a9f;
        Error::Error((Error *)local_58,(Flags)0x0);
        pDVar4 = Debug::operator<<((Debug *)local_58,"Utility::Path::mapWrite(): can\'t map");
        value._data = (char *)this;
        pDVar4 = Debug::operator<<(pDVar4,value);
        (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
        Debug::operator<<(pDVar4,":");
        piVar5 = __errno_location();
        Implementation::printErrnoErrorString((Debug *)local_58,*piVar5);
        close(__fd);
      }
      else {
        Error::Error((Error *)local_58,(Flags)0x0);
        pDVar4 = Debug::operator<<((Debug *)local_58,
                                   "Utility::Path::mapWrite(): can\'t write to resize");
        value_02._sizePlusFlags = (size_t)value._sizePlusFlags;
        value_02._data = (char *)this;
        pDVar4 = Debug::operator<<(pDVar4,value_02);
        (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
        Debug::operator<<(pDVar4,":");
        piVar5 = __errno_location();
        Implementation::printErrnoErrorString((Debug *)local_58,*piVar5);
        close(__fd);
      }
    }
  }
  __return_storage_ptr__->_set = false;
  Error::~Error((Error *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<Containers::Array<char, MapDeleter>> mapWrite(const Containers::StringView filename, const std::size_t size) {
    #ifdef CORRADE_TARGET_UNIX
    /* Open the file for writing. Create if it doesn't exist, truncate it if it
       does. */
    const int fd = open(filename.data(), O_RDWR|O_CREAT|O_TRUNC, mode_t(0600));
    if(fd == -1) {
        Error err;
        err << "Utility::Path::mapWrite(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return {};
    }

    /* Can't seek, write or mmap() with a zero size, so if the file is empty
       just set the pointer to null -- but for consistency keep the fd open and
       let it be handled by the deleter. Array guarantees that deleter gets
       called even in case of a null data. */
    char* data;
    if(!size) {
         data = nullptr;
    } else {
        /* Resize the file to requested size by seeking one byte before */
        if(lseek(fd, size - 1, SEEK_SET) == -1) {
            Error err;
            err << "Utility::Path::mapWrite(): can't seek to resize" << filename << Debug::nospace << ":";
            Utility::Implementation::printErrnoErrorString(err, errno);
            close(fd);
            return {};
        }

        /* And then writing a zero byte on that position */
        if(::write(fd, "", 1) != 1) {
            Error err;
            err << "Utility::Path::mapWrite(): can't write to resize" << filename << Debug::nospace << ":";
            Utility::Implementation::printErrnoErrorString(err, errno);
            close(fd);
            return {};
        }

        /* Map the file */
        if((data = reinterpret_cast<char*>(mmap(nullptr, size, PROT_READ|PROT_WRITE, MAP_SHARED, fd, 0))) == MAP_FAILED) {
            Error err;
            err << "Utility::Path::mapWrite(): can't map" << filename << Debug::nospace << ":";
            Utility::Implementation::printErrnoErrorString(err, errno);
            close(fd);
            return {};
        }
    }

    return Containers::Array<char, MapDeleter>{data, size, MapDeleter{fd}};
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)    /* Open the file for writing. Create if it doesn't exist, truncate it if it
       does. */
    HANDLE hFile = CreateFileW(Unicode::widen(filename),
        GENERIC_READ|GENERIC_WRITE, FILE_SHARE_READ|FILE_SHARE_WRITE, nullptr, CREATE_ALWAYS, 0, nullptr);
    if(hFile == INVALID_HANDLE_VALUE) {
        Error err;
        err << "Utility::Path::mapWrite(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printWindowsErrorString(err, GetLastError());
        return {};
    }

    /* Can't call CreateFileMapping() with a zero size, so if the file is empty
       just set the pointer to null -- but for consistency keep the handle open
       and let it be handled by the deleter. Array guarantees that deleter gets
       called even in case of a null data. */
    HANDLE hMap;
    char* data;
    if(!size) {
        hMap = {};
        data = nullptr;
    } else {
        /* Create the file mapping */
        if(!(hMap = CreateFileMappingW(hFile, nullptr, PAGE_READWRITE, 0, size, nullptr))) {
            Error err;
            err << "Utility::Path::mapWrite(): can't create file mapping for" << filename << Debug::nospace << ":";
            Utility::Implementation::printWindowsErrorString(err, GetLastError());
            CloseHandle(hFile);
            return {};
        }

        /* Map the file */
        if(!(data = reinterpret_cast<char*>(MapViewOfFile(hMap, FILE_MAP_ALL_ACCESS, 0, 0, 0)))) {
            Error err;
            err << "Utility::Path::mapWrite(): can't map" << filename << Debug::nospace << ":";
            Utility::Implementation::printWindowsErrorString(err, GetLastError());
            CloseHandle(hMap);
            CloseHandle(hFile);
            return {};
        }
    }

    return Containers::Array<char, MapDeleter>{data, size, MapDeleter{hFile, hMap}};
    #endif
}